

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Crop_x86_avx512::forward(Crop_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar10;
  undefined4 uVar11;
  int *piVar6;
  void *pvVar7;
  Allocator *pAVar8;
  ulong uVar9;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  bool bVar40;
  pointer pMVar41;
  int iVar42;
  int iVar43;
  sbyte sVar44;
  int iVar45;
  size_t sVar46;
  Mat *pMVar47;
  long lVar48;
  int iVar49;
  uint uVar50;
  ulong uVar51;
  long lVar52;
  bool bVar53;
  bool bVar54;
  int _outw;
  int _outh;
  int _woffset;
  Mat m;
  int _outc;
  int _outd;
  int _hoffset;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blob_shapes;
  int iStack_100;
  Allocator *pAStack_f8;
  undefined8 uStack_f0;
  int iStack_e8;
  int iStack_e4;
  int iStack_e0;
  size_t local_d8;
  int _coffset;
  size_t local_b0;
  ulong local_a8;
  uint local_9c;
  Mat m_2;
  int _doffset;
  
  uVar1 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  iVar43 = bottom_blob->d;
  local_9c = bottom_blob->c;
  pMVar47 = (Mat *)(ulong)local_9c;
  uVar50 = bottom_blob->dims;
  local_a8 = (ulong)uVar50;
  local_b0 = bottom_blob->elemsize;
  iVar3 = bottom_blob->elempack;
  if (((this->super_Crop).starts_expr._M_string_length == 0) ||
     ((this->super_Crop).ends_expr._M_string_length == 0)) {
    if (uVar50 - 1 < 4) {
      lVar52 = (long)(int)uVar1;
      m.w = uVar1;
      switch(uVar50) {
      case 1:
        m.w = iVar3 * uVar1;
        m.dims = 1;
        m.h = 1;
        m.d = 1;
        m.c = 1;
        m.cstep = (size_t)m.w;
        goto LAB_00291726;
      case 2:
        m.h = iVar3 * uVar2;
        m.elemsize._0_4_ = 4;
        m.elempack = 1;
        m.dims = 2;
        m.d = 1;
        m.c = 1;
        m.cstep = m.h * lVar52;
        goto LAB_002917b5;
      case 3:
        m.dims = 3;
        m.d = 1;
        lVar52 = (int)uVar2 * lVar52;
        break;
      case 4:
        m.dims = 4;
        lVar52 = (int)uVar2 * lVar52 * (long)iVar43;
        m.d = iVar43;
      }
      m.c = iVar3 * local_9c;
      m.cstep = lVar52 + 3U & 0x3ffffffffffffffc;
      m.h = uVar2;
LAB_00291726:
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
    }
    else {
      m.cstep = 0;
      m.elemsize._0_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
LAB_002917b5:
    m.elemsize._4_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.allocator = (Allocator *)0x0;
    m.data = (void *)0x0;
    Crop::resolve_crop_roi
              (&this->super_Crop,&m,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,
               &_outc);
    piVar6 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    goto LAB_00291adb;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blob_shapes,1,(allocator_type *)&m);
  pMVar41 = bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  switch(bottom_blob->dims) {
  case 1:
    m.w = bottom_blob->elempack * bottom_blob->w;
    m.dims = 1;
    m.h = 1;
    m.d = 1;
    m.c = 1;
    m.cstep = (size_t)m.w;
    goto LAB_002918fc;
  case 2:
    m.w = bottom_blob->w;
    m.h = bottom_blob->elempack * bottom_blob->h;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 2;
    m.d = 1;
    m.c = 1;
    m.cstep = (long)m.h * (long)m.w;
    break;
  case 3:
    m.c = bottom_blob->elempack * bottom_blob->c;
    m.dims = 3;
    uVar4 = bottom_blob->w;
    uVar10 = bottom_blob->h;
    m.d = 1;
    lVar52 = (long)(int)uVar10 * (long)(int)uVar4;
    m.w = uVar4;
    m.h = uVar10;
    goto LAB_002918f4;
  case 4:
    m.d = bottom_blob->d;
    m.c = bottom_blob->elempack * bottom_blob->c;
    m.dims = 4;
    uVar5 = bottom_blob->w;
    uVar11 = bottom_blob->h;
    lVar52 = (long)(int)uVar11 * (long)m.d * (long)(int)uVar5;
    m.w = uVar5;
    m.h = uVar11;
LAB_002918f4:
    m.cstep = (lVar52 * 4 + 0xfU & 0xfffffffffffffff0) >> 2;
LAB_002918fc:
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    break;
  default:
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != &m) {
    piVar6 = (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->data != (void *)0x0) {
            free((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start)->data);
          }
        }
        else {
          (*(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar41->cstep = 0;
    pMVar41->data = (void *)0x0;
    pMVar41->refcount = (int *)0x0;
    *(undefined8 *)((long)&pMVar41->refcount + 4) = 0;
    *(undefined8 *)((long)&pMVar41->elemsize + 4) = 0;
    pMVar41->dims = 0;
    pMVar41->w = 0;
    pMVar41->h = 0;
    pMVar41->d = 0;
    pMVar41->c = 0;
    pMVar41->data = m.data;
    pMVar41->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    pMVar41->elemsize = CONCAT44(m.elemsize._4_4_,(int)m.elemsize);
    pMVar41->elempack = m.elempack;
    pMVar41->allocator = m.allocator;
    pMVar41->dims = m.dims;
    pMVar41->w = m.w;
    pMVar41->h = m.h;
    pMVar41->d = m.d;
    pMVar41->c = m.c;
    pMVar41->cstep = m.cstep;
  }
  piVar6 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  Crop::eval_crop_expr
            (&this->super_Crop,&bottom_blob_shapes,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,
             &_outh,&_outd,&_outc);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blob_shapes);
  pMVar47 = bottom_blob;
LAB_00291adb:
  iVar45 = (int)pMVar47;
  if (iVar3 == 0x10) {
    if ((int)local_a8 == 1) {
      if ((_outw & 0xfU) == 0) {
        uVar51 = 0x10;
      }
      else if ((_outw & 7U) == 0) {
        uVar51 = 8;
      }
      else {
        uVar51 = (ulong)((uint)((_outw & 3U) == 0) * 3 + 1);
      }
      iVar49 = (int)uVar51;
      if (iVar49 == 0x10 && _outw / iVar49 == uVar1) {
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar45 = bottom_blob->w;
          iVar49 = bottom_blob->h;
          iVar42 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar45;
          top_blob->h = iVar49;
          top_blob->d = iVar42;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
LAB_00291c86:
        bVar53 = false;
        iVar45 = 0;
      }
      else {
        bVar53 = true;
        if ((iVar49 == 0x10) && ((_woffset & 0xfU) == 0)) {
          Mat::create(top_blob,_outw / iVar49,uVar51 * (local_b0 >> 4),0x10,opt->blob_allocator);
          iVar45 = -100;
          if (top_blob->data == (void *)0x0) {
            bVar53 = false;
          }
          else {
            bVar53 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar45 = _woffset + 0xf;
              if (-1 < _woffset) {
                iVar45 = _woffset;
              }
              crop_pack16_avx512(bottom_blob,top_blob,0,iVar45 >> 4);
              goto LAB_00291c86;
            }
          }
        }
      }
      if (!bVar53) {
        return iVar45;
      }
    }
    if ((int)local_a8 == 2) {
      if ((_outh & 0xfU) == 0) {
        uVar51 = 0x10;
      }
      else if ((_outh & 7U) == 0) {
        uVar51 = 8;
      }
      else {
        uVar51 = (ulong)((uint)((_outh & 3U) == 0) * 3 + 1);
      }
      iVar49 = (int)uVar51;
      if (_outw == uVar1) {
        if ((iVar49 != 0x10) || (_outh / iVar49 != uVar2)) goto LAB_00291d30;
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pvVar7 = top_blob->data;
              pAVar8 = top_blob->allocator;
              if (pAVar8 == (Allocator *)0x0) {
                if (pvVar7 != (void *)0x0) {
                  free(pvVar7);
                }
              }
              else {
                (*pAVar8->_vptr_Allocator[3])(pAVar8,pvVar7,(long)_outh % (long)iVar49 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar45 = bottom_blob->w;
          iVar49 = bottom_blob->h;
          iVar42 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar45;
          top_blob->h = iVar49;
          top_blob->d = iVar42;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
LAB_00291e41:
        bVar53 = false;
        iVar45 = 0;
      }
      else {
LAB_00291d30:
        bVar53 = true;
        if ((iVar49 == 0x10) && ((_hoffset & 0xfU) == 0)) {
          iVar45 = _outh + 0xf;
          if (-1 < _outh) {
            iVar45 = _outh;
          }
          Mat::create(top_blob,_outw,iVar45 >> 4,uVar51 * (local_b0 >> 4),0x10,opt->blob_allocator);
          iVar45 = -100;
          if (top_blob->data == (void *)0x0) {
            bVar53 = false;
          }
          else {
            bVar53 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar45 = _hoffset + 0xf;
              if (-1 < _hoffset) {
                iVar45 = _hoffset;
              }
              crop_pack16_avx512(bottom_blob,top_blob,iVar45 >> 4,_woffset);
              goto LAB_00291e41;
            }
          }
        }
      }
      if (!bVar53) {
        return iVar45;
      }
    }
    if ((int)local_a8 == 3) {
      if ((_outc & 0xfU) == 0) {
        uVar50 = 0x10;
      }
      else if ((_outc & 7U) == 0) {
        uVar50 = 8;
      }
      else {
        uVar50 = (uint)((_outc & 3U) == 0) * 3 + 1;
      }
      if (_outh != uVar2 || _outw != uVar1) {
LAB_00291f07:
        bVar53 = true;
        if (uVar50 == 0x10 && (_coffset & 0xfU) == 0) {
          iVar45 = _outc + 0xf;
          if (-1 < _outc) {
            iVar45 = _outc;
          }
          m.c = iVar45 >> 4;
          uVar51 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset >> 4) * bottom_blob->cstep * uVar51 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar51;
          m.elemsize._4_4_ = (undefined4)(uVar51 >> 0x20);
          uVar12 = bottom_blob->dims;
          uVar13 = bottom_blob->w;
          uVar14 = bottom_blob->h;
          uVar15 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar51 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar51;
          m.dims = uVar12;
          m.w = uVar13;
          m.h = uVar14;
          m.d = uVar15;
          if (_outh != uVar2 || _outw != uVar1) {
LAB_00292184:
            iVar45 = _outc + 0xf;
            if (-1 < _outc) {
              iVar45 = _outc;
            }
            Mat::create(top_blob,_outw,_outh,iVar45 >> 4,(ulong)uVar50 * (local_b0 >> 4),0x10,
                        opt->blob_allocator);
            iVar45 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                iVar45 = 0;
              }
              else {
                lVar52 = 0;
                do {
                  pAVar8 = m.allocator;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(m.cstep * lVar52 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize) +
                                (long)m.data);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                  pAStack_f8 = m.allocator;
                  m_2.h = top_blob->h;
                  m_2.c = top_blob->d;
                  uVar51 = top_blob->elemsize;
                  m_2.data = (void *)(top_blob->cstep * lVar52 * uVar51 + (long)top_blob->data);
                  m_2.elempack = top_blob->elempack;
                  m_2.allocator = top_blob->allocator;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = (undefined4)uVar51;
                  m_2.elemsize._4_4_ = (undefined4)(uVar51 >> 0x20);
                  m_2.d = 1;
                  sVar46 = (long)m_2.h * (long)top_blob->w;
                  m_2.w = top_blob->w;
                  m_2.dims = top_blob->dims + -1;
                  m_2.cstep = (uVar51 * sVar46 + 0xf & 0xfffffffffffffff0) / uVar51;
                  if (top_blob->dims == 4) {
                    m_2.cstep = sVar46;
                  }
                  crop_pack16_avx512((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                  m_2.cstep = 0;
                  m_2.data = (void *)0x0;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = 0;
                  m_2.elemsize._4_4_ = 0;
                  m_2.elempack = 0;
                  m_2.dims = 0;
                  m_2.w = 0;
                  m_2.h = 0;
                  m_2.d = 0;
                  m_2.c = 0;
                  piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (pAVar8 == (Allocator *)0x0) {
                        if (bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*pAVar8->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_d8 = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  iStack_100 = 0;
                  uStack_f0._0_4_ = 0;
                  uStack_f0._4_4_ = 0;
                  iStack_e8 = 0;
                  iStack_e4 = 0;
                  iStack_e0 = 0;
                  lVar52 = lVar52 + 1;
                } while (lVar52 < top_blob->c);
                iVar45 = 0;
              }
            }
          }
          else {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,(int)m.elemsize,
                       m.allocator);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              piVar6 = top_blob->refcount;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              top_blob->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              top_blob->elempack = iStack_100;
              top_blob->allocator = pAStack_f8;
              top_blob->dims = (int)uStack_f0;
              top_blob->w = uStack_f0._4_4_;
              top_blob->h = iStack_e8;
              top_blob->d = iStack_e4;
              top_blob->c = iStack_e0;
              top_blob->cstep = local_d8;
            }
            piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (pAStack_f8 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*pAStack_f8->_vptr_Allocator[3])();
                }
              }
            }
            iVar45 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_00292184;
          }
          piVar6 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar53 = false;
        }
      }
      else {
        if ((uVar50 != 0x10) || (_outc / (int)uVar50 != local_9c)) goto LAB_00291f07;
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pvVar7 = top_blob->data;
              pAVar8 = top_blob->allocator;
              if (pAVar8 == (Allocator *)0x0) {
                if (pvVar7 != (void *)0x0) {
                  free(pvVar7);
                }
              }
              else {
                (*pAVar8->_vptr_Allocator[3])
                          (pAVar8,pvVar7,(long)_outc % (long)(int)uVar50 & 0xffffffff);
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar45 = bottom_blob->w;
          iVar49 = bottom_blob->h;
          iVar42 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar45;
          top_blob->h = iVar49;
          top_blob->d = iVar42;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        bVar53 = false;
        iVar45 = 0;
      }
      if (!bVar53) {
        return iVar45;
      }
    }
    if ((int)local_a8 == 4) {
      if ((_outc & 0xfU) == 0) {
        uVar50 = 0x10;
      }
      else if ((_outc & 7U) == 0) {
        uVar50 = 8;
      }
      else {
        uVar50 = (uint)((_outc & 3U) == 0) * 3 + 1;
      }
      bVar53 = _outd != iVar43 || (_outh != uVar2 || _outw != uVar1);
      if (bVar53) {
LAB_002925b2:
        bVar54 = true;
        if (uVar50 == 0x10 && (_coffset & 0xfU) == 0) {
          iVar45 = _outc + 0xf;
          if (-1 < _outc) {
            iVar45 = _outc;
          }
          m.c = iVar45 >> 4;
          uVar51 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset >> 4) * bottom_blob->cstep * uVar51 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar51;
          m.elemsize._4_4_ = (undefined4)(uVar51 >> 0x20);
          uVar28 = bottom_blob->dims;
          uVar29 = bottom_blob->w;
          uVar30 = bottom_blob->h;
          uVar31 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar51 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar51;
          m.dims = uVar28;
          m.w = uVar29;
          m.h = uVar30;
          m.d = uVar31;
          if (bVar53) {
LAB_0029282f:
            iVar45 = _outc + 0xf;
            if (-1 < _outc) {
              iVar45 = _outc;
            }
            Mat::create(top_blob,_outw,_outh,_outd,iVar45 >> 4,(ulong)uVar50 * (local_b0 >> 4),0x10,
                        opt->blob_allocator);
            iVar45 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                iVar45 = 0;
              }
              else {
                lVar52 = 0;
                do {
                  if (0 < _outd) {
                    lVar48 = 0;
                    do {
                      pAVar8 = m.allocator;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           (pointer)((long)m.data +
                                    (long)(_doffset + (int)lVar48) *
                                    CONCAT44(m.elemsize._4_4_,(int)m.elemsize) *
                                    (long)m.h * (long)m.w +
                                    m.cstep * lVar52 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize));
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                      pAStack_f8 = m.allocator;
                      m_2.h = top_blob->h;
                      sVar46 = top_blob->elemsize;
                      m_2.elempack = top_blob->elempack;
                      m_2.allocator = top_blob->allocator;
                      m_2.cstep = (long)m_2.h * (long)top_blob->w;
                      m_2.data = (void *)((long)top_blob->data +
                                         lVar48 * sVar46 * m_2.cstep +
                                         top_blob->cstep * lVar52 * sVar46);
                      m_2.refcount._0_4_ = 0;
                      m_2.refcount._4_4_ = 0;
                      m_2.elemsize._0_4_ = (undefined4)sVar46;
                      m_2.elemsize._4_4_ = (undefined4)(sVar46 >> 0x20);
                      m_2.w = top_blob->w;
                      m_2.dims = 2;
                      m_2.d = 1;
                      m_2.c = 1;
                      crop_pack16_avx512((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                      piVar6 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                      if (piVar6 != (int *)0x0) {
                        LOCK();
                        *piVar6 = *piVar6 + -1;
                        UNLOCK();
                        if (*piVar6 == 0) {
                          if (m_2.allocator == (Allocator *)0x0) {
                            if (m_2.data != (void *)0x0) {
                              free(m_2.data);
                            }
                          }
                          else {
                            (*(m_2.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_2.cstep = 0;
                      m_2.data = (void *)0x0;
                      m_2.refcount._0_4_ = 0;
                      m_2.refcount._4_4_ = 0;
                      m_2.elemsize._0_4_ = 0;
                      m_2.elemsize._4_4_ = 0;
                      m_2.elempack = 0;
                      m_2.dims = 0;
                      m_2.w = 0;
                      m_2.h = 0;
                      m_2.d = 0;
                      m_2.c = 0;
                      piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                               bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                      if (piVar6 != (int *)0x0) {
                        LOCK();
                        *piVar6 = *piVar6 + -1;
                        UNLOCK();
                        if (*piVar6 == 0) {
                          if (pAVar8 == (Allocator *)0x0) {
                            if (bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start != (pointer)0x0) {
                              free(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start);
                            }
                          }
                          else {
                            (*pAVar8->_vptr_Allocator[3])();
                          }
                        }
                      }
                      local_d8 = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      iStack_100 = 0;
                      uStack_f0._0_4_ = 0;
                      uStack_f0._4_4_ = 0;
                      iStack_e8 = 0;
                      iStack_e4 = 0;
                      iStack_e0 = 0;
                      lVar48 = lVar48 + 1;
                    } while (lVar48 < _outd);
                  }
                  lVar52 = lVar52 + 1;
                } while (lVar52 < top_blob->c);
                iVar45 = 0;
              }
            }
          }
          else {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,(int)m.elemsize,
                       m.allocator);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              piVar6 = top_blob->refcount;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              top_blob->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              top_blob->elempack = iStack_100;
              top_blob->allocator = pAStack_f8;
              top_blob->dims = (int)uStack_f0;
              top_blob->w = uStack_f0._4_4_;
              top_blob->h = iStack_e8;
              top_blob->d = iStack_e4;
              top_blob->c = iStack_e0;
              top_blob->cstep = local_d8;
            }
            piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (pAStack_f8 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*pAStack_f8->_vptr_Allocator[3])();
                }
              }
            }
            iVar45 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_0029282f;
          }
          piVar6 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar54 = false;
        }
      }
      else {
        if ((uVar50 != 0x10) || (_outc / (int)uVar50 != local_9c)) goto LAB_002925b2;
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pvVar7 = top_blob->data;
              pAVar8 = top_blob->allocator;
              if (pAVar8 == (Allocator *)0x0) {
                if (pvVar7 != (void *)0x0) {
                  free(pvVar7);
                }
              }
              else {
                (*pAVar8->_vptr_Allocator[3])
                          (pAVar8,pvVar7,(long)_outc % (long)(int)uVar50 & 0xffffffff);
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar45 = bottom_blob->w;
          iVar49 = bottom_blob->h;
          iVar42 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar45;
          top_blob->h = iVar49;
          top_blob->d = iVar42;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        bVar54 = false;
        iVar45 = 0;
      }
      if (!bVar54) {
        return iVar45;
      }
    }
  }
  if (iVar3 == 8) {
    if ((int)local_a8 == 1) {
      uVar50 = _outw & 7;
      bVar53 = (_outw & 3U) == 0;
      iVar49 = 8;
      if (uVar50 != 0) {
        iVar49 = (uint)bVar53 * 3 + 1;
      }
      sVar44 = 3;
      if (uVar50 != 0) {
        sVar44 = bVar53 * '\x02';
      }
      if (_outw / iVar49 == uVar1 && uVar50 == 0) {
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pvVar7 = top_blob->data;
              pAVar8 = top_blob->allocator;
              if (pAVar8 == (Allocator *)0x0) {
                if (pvVar7 != (void *)0x0) {
                  free(pvVar7);
                }
              }
              else {
                (*pAVar8->_vptr_Allocator[3])(pAVar8,pvVar7,(long)_outw % (long)iVar49 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar45 = bottom_blob->w;
          iVar49 = bottom_blob->h;
          iVar42 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar45;
          top_blob->h = iVar49;
          top_blob->d = iVar42;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
LAB_00292d32:
        bVar53 = false;
        iVar45 = 0;
      }
      else {
        bVar53 = true;
        if (((_outw | _woffset) & 7U) == 0) {
          Mat::create(top_blob,_outw / iVar49,(local_b0 >> 3) << sVar44,8,opt->blob_allocator);
          iVar45 = -100;
          if (top_blob->data == (void *)0x0) {
            bVar53 = false;
          }
          else {
            bVar53 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar45 = _woffset + 7;
              if (-1 < _woffset) {
                iVar45 = _woffset;
              }
              crop_pack8_avx(bottom_blob,top_blob,0,iVar45 >> 3);
              goto LAB_00292d32;
            }
          }
        }
      }
      if (!bVar53) {
        return iVar45;
      }
    }
    if ((int)local_a8 == 2) {
      sVar44 = 3;
      if ((_outh & 7U) != 0) {
        sVar44 = ((_outh & 3U) == 0) * '\x02';
      }
      if (_outw == uVar1) {
        iVar49 = 8;
        if ((_outh & 7U) != 0) {
          iVar49 = (uint)((_outh & 3U) == 0) * 3 + 1;
        }
        if (((_outh & 7U) != 0) || (_outh / iVar49 != uVar2)) goto LAB_00292df5;
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pvVar7 = top_blob->data;
              pAVar8 = top_blob->allocator;
              if (pAVar8 == (Allocator *)0x0) {
                if (pvVar7 != (void *)0x0) {
                  free(pvVar7);
                }
              }
              else {
                (*pAVar8->_vptr_Allocator[3])(pAVar8,pvVar7,(long)_outh % (long)iVar49 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar45 = bottom_blob->w;
          iVar49 = bottom_blob->h;
          iVar42 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar45;
          top_blob->h = iVar49;
          top_blob->d = iVar42;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
LAB_00292eef:
        bVar53 = false;
        iVar45 = 0;
      }
      else {
LAB_00292df5:
        bVar53 = true;
        if (((_hoffset | _outh) & 7U) == 0) {
          iVar45 = _outh + 7;
          if (-1 < _outh) {
            iVar45 = _outh;
          }
          Mat::create(top_blob,_outw,iVar45 >> 3,(local_b0 >> 3) << sVar44,8,opt->blob_allocator);
          iVar45 = -100;
          if (top_blob->data == (void *)0x0) {
            bVar53 = false;
          }
          else {
            bVar53 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar45 = _hoffset + 7;
              if (-1 < _hoffset) {
                iVar45 = _hoffset;
              }
              crop_pack8_avx(bottom_blob,top_blob,iVar45 >> 3,_woffset);
              goto LAB_00292eef;
            }
          }
        }
      }
      if (!bVar53) {
        return iVar45;
      }
    }
    if ((int)local_a8 == 3) {
      uVar51 = local_b0 >> 3;
      sVar44 = 3;
      if ((_outc & 7U) != 0) {
        sVar44 = ((_outc & 3U) == 0) * '\x02';
      }
      uVar50 = _outh ^ uVar2 | _outw ^ uVar1;
      bVar53 = uVar50 == 0;
      if (bVar53) {
        iVar49 = 8;
        if ((_outc & 7U) != 0) {
          iVar49 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        if (((_outc & 7U) != 0) || (_outc / iVar49 != local_9c)) goto LAB_00292fca;
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pvVar7 = top_blob->data;
              pAVar8 = top_blob->allocator;
              if (pAVar8 == (Allocator *)0x0) {
                if (pvVar7 != (void *)0x0) {
                  free(pvVar7);
                }
              }
              else {
                (*pAVar8->_vptr_Allocator[3])(pAVar8,pvVar7,(long)_outc % (long)iVar49 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar45 = bottom_blob->w;
          iVar49 = bottom_blob->h;
          iVar42 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar45;
          top_blob->h = iVar49;
          top_blob->d = iVar42;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        bVar54 = false;
        iVar45 = 0;
      }
      else {
LAB_00292fca:
        bVar54 = true;
        if (((_coffset | _outc) & 7U) == 0) {
          iVar45 = _coffset + 7;
          if (-1 < _coffset) {
            iVar45 = _coffset;
          }
          iVar49 = _outc + 7;
          if (-1 < _outc) {
            iVar49 = _outc;
          }
          m.c = iVar49 >> 3;
          uVar9 = bottom_blob->elemsize;
          m.data = (void *)((long)(iVar45 >> 3) * bottom_blob->cstep * uVar9 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar9;
          m.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
          uVar16 = bottom_blob->dims;
          uVar17 = bottom_blob->w;
          uVar18 = bottom_blob->h;
          uVar19 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar9 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar9;
          m.dims = uVar16;
          m.w = uVar17;
          m.h = uVar18;
          m.d = uVar19;
          if (bVar53) {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,
                       CONCAT31((int3)(uVar50 >> 8),bVar53),m.allocator);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              piVar6 = top_blob->refcount;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              top_blob->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              top_blob->elempack = iStack_100;
              top_blob->allocator = pAStack_f8;
              top_blob->dims = (int)uStack_f0;
              top_blob->w = uStack_f0._4_4_;
              top_blob->h = iStack_e8;
              top_blob->d = iStack_e4;
              top_blob->c = iStack_e0;
              top_blob->cstep = local_d8;
            }
            piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (pAStack_f8 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*pAStack_f8->_vptr_Allocator[3])();
                }
              }
            }
            iVar45 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_00293246;
          }
          else {
LAB_00293246:
            iVar45 = _outc + 7;
            if (-1 < _outc) {
              iVar45 = _outc;
            }
            Mat::create(top_blob,_outw,_outh,iVar45 >> 3,uVar51 << sVar44,8,opt->blob_allocator);
            iVar45 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                iVar45 = 0;
              }
              else {
                lVar52 = 0;
                do {
                  pAVar8 = m.allocator;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(m.cstep * lVar52 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize) +
                                (long)m.data);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                  pAStack_f8 = m.allocator;
                  m_2.h = top_blob->h;
                  m_2.c = top_blob->d;
                  uVar51 = top_blob->elemsize;
                  m_2.data = (void *)(top_blob->cstep * lVar52 * uVar51 + (long)top_blob->data);
                  m_2.elempack = top_blob->elempack;
                  m_2.allocator = top_blob->allocator;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = (undefined4)uVar51;
                  m_2.elemsize._4_4_ = (undefined4)(uVar51 >> 0x20);
                  m_2.d = 1;
                  sVar46 = (long)m_2.h * (long)top_blob->w;
                  m_2.w = top_blob->w;
                  m_2.dims = top_blob->dims + -1;
                  m_2.cstep = (uVar51 * sVar46 + 0xf & 0xfffffffffffffff0) / uVar51;
                  if (top_blob->dims == 4) {
                    m_2.cstep = sVar46;
                  }
                  crop_pack8_avx((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                  m_2.cstep = 0;
                  m_2.data = (void *)0x0;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = 0;
                  m_2.elemsize._4_4_ = 0;
                  m_2.elempack = 0;
                  m_2.dims = 0;
                  m_2.w = 0;
                  m_2.h = 0;
                  m_2.d = 0;
                  m_2.c = 0;
                  piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (pAVar8 == (Allocator *)0x0) {
                        if (bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*pAVar8->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_d8 = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  iStack_100 = 0;
                  uStack_f0._0_4_ = 0;
                  uStack_f0._4_4_ = 0;
                  iStack_e8 = 0;
                  iStack_e4 = 0;
                  iStack_e0 = 0;
                  lVar52 = lVar52 + 1;
                } while (lVar52 < top_blob->c);
                iVar45 = 0;
              }
            }
          }
          piVar6 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar54 = false;
        }
      }
      if (!bVar54) {
        return iVar45;
      }
    }
    if ((int)local_a8 == 4) {
      uVar51 = local_b0 >> 3;
      sVar44 = 3;
      if ((_outc & 7U) != 0) {
        sVar44 = ((_outc & 3U) == 0) * '\x02';
      }
      uVar50 = _outh ^ uVar2 | _outw ^ uVar1;
      bVar53 = _outd == iVar43;
      bVar54 = uVar50 == 0;
      if (bVar53 && bVar54) {
        iVar49 = 8;
        if ((_outc & 7U) != 0) {
          iVar49 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        if (((_outc & 7U) != 0) || (_outc / iVar49 != local_9c)) goto LAB_00293679;
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pvVar7 = top_blob->data;
              pAVar8 = top_blob->allocator;
              if (pAVar8 == (Allocator *)0x0) {
                if (pvVar7 != (void *)0x0) {
                  free(pvVar7);
                }
              }
              else {
                (*pAVar8->_vptr_Allocator[3])(pAVar8,pvVar7,(long)_outc % (long)iVar49 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar45 = bottom_blob->w;
          iVar49 = bottom_blob->h;
          iVar42 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar45;
          top_blob->h = iVar49;
          top_blob->d = iVar42;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        bVar40 = false;
        iVar45 = 0;
      }
      else {
LAB_00293679:
        bVar40 = true;
        if (((_coffset | _outc) & 7U) == 0) {
          iVar45 = _coffset + 7;
          if (-1 < _coffset) {
            iVar45 = _coffset;
          }
          iVar49 = _outc + 7;
          if (-1 < _outc) {
            iVar49 = _outc;
          }
          m.c = iVar49 >> 3;
          uVar9 = bottom_blob->elemsize;
          m.data = (void *)((long)(iVar45 >> 3) * bottom_blob->cstep * uVar9 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar9;
          m.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
          uVar32 = bottom_blob->dims;
          uVar33 = bottom_blob->w;
          uVar34 = bottom_blob->h;
          uVar35 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar9 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar9;
          m.dims = uVar32;
          m.w = uVar33;
          m.h = uVar34;
          m.d = uVar35;
          if (bVar53 && bVar54) {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,
                       CONCAT31((int3)(uVar50 >> 8),bVar53 && bVar54),m.allocator);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              piVar6 = top_blob->refcount;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              top_blob->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              top_blob->elempack = iStack_100;
              top_blob->allocator = pAStack_f8;
              top_blob->dims = (int)uStack_f0;
              top_blob->w = uStack_f0._4_4_;
              top_blob->h = iStack_e8;
              top_blob->d = iStack_e4;
              top_blob->c = iStack_e0;
              top_blob->cstep = local_d8;
            }
            piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (pAStack_f8 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*pAStack_f8->_vptr_Allocator[3])();
                }
              }
            }
            iVar45 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_002938f5;
          }
          else {
LAB_002938f5:
            iVar45 = _outc + 7;
            if (-1 < _outc) {
              iVar45 = _outc;
            }
            Mat::create(top_blob,_outw,_outh,_outd,iVar45 >> 3,uVar51 << sVar44,8,
                        opt->blob_allocator);
            iVar45 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                iVar45 = 0;
              }
              else {
                lVar52 = 0;
                do {
                  if (0 < _outd) {
                    lVar48 = 0;
                    do {
                      pAVar8 = m.allocator;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           (pointer)((long)m.data +
                                    (long)(_doffset + (int)lVar48) *
                                    CONCAT44(m.elemsize._4_4_,(int)m.elemsize) *
                                    (long)m.h * (long)m.w +
                                    m.cstep * lVar52 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize));
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                      pAStack_f8 = m.allocator;
                      m_2.h = top_blob->h;
                      sVar46 = top_blob->elemsize;
                      m_2.elempack = top_blob->elempack;
                      m_2.allocator = top_blob->allocator;
                      m_2.cstep = (long)m_2.h * (long)top_blob->w;
                      m_2.data = (void *)((long)top_blob->data +
                                         lVar48 * sVar46 * m_2.cstep +
                                         top_blob->cstep * lVar52 * sVar46);
                      m_2.refcount._0_4_ = 0;
                      m_2.refcount._4_4_ = 0;
                      m_2.elemsize._0_4_ = (undefined4)sVar46;
                      m_2.elemsize._4_4_ = (undefined4)(sVar46 >> 0x20);
                      m_2.w = top_blob->w;
                      m_2.dims = 2;
                      m_2.d = 1;
                      m_2.c = 1;
                      crop_pack8_avx((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                      piVar6 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                      if (piVar6 != (int *)0x0) {
                        LOCK();
                        *piVar6 = *piVar6 + -1;
                        UNLOCK();
                        if (*piVar6 == 0) {
                          if (m_2.allocator == (Allocator *)0x0) {
                            if (m_2.data != (void *)0x0) {
                              free(m_2.data);
                            }
                          }
                          else {
                            (*(m_2.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_2.cstep = 0;
                      m_2.data = (void *)0x0;
                      m_2.refcount._0_4_ = 0;
                      m_2.refcount._4_4_ = 0;
                      m_2.elemsize._0_4_ = 0;
                      m_2.elemsize._4_4_ = 0;
                      m_2.elempack = 0;
                      m_2.dims = 0;
                      m_2.w = 0;
                      m_2.h = 0;
                      m_2.d = 0;
                      m_2.c = 0;
                      piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                               bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                      if (piVar6 != (int *)0x0) {
                        LOCK();
                        *piVar6 = *piVar6 + -1;
                        UNLOCK();
                        if (*piVar6 == 0) {
                          if (pAVar8 == (Allocator *)0x0) {
                            if (bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start != (pointer)0x0) {
                              free(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start);
                            }
                          }
                          else {
                            (*pAVar8->_vptr_Allocator[3])();
                          }
                        }
                      }
                      local_d8 = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      iStack_100 = 0;
                      uStack_f0._0_4_ = 0;
                      uStack_f0._4_4_ = 0;
                      iStack_e8 = 0;
                      iStack_e4 = 0;
                      iStack_e0 = 0;
                      lVar48 = lVar48 + 1;
                    } while (lVar48 < _outd);
                  }
                  lVar52 = lVar52 + 1;
                } while (lVar52 < top_blob->c);
                iVar45 = 0;
              }
            }
          }
          piVar6 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar40 = false;
        }
      }
      if (!bVar40) {
        return iVar45;
      }
    }
  }
  if (iVar3 == 4) {
    if ((int)local_a8 == 1) {
      uVar50 = _outw & 3;
      iVar49 = (uint)(uVar50 == 0) * 3 + 1;
      if (_outw / iVar49 == uVar1 && uVar50 == 0) {
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pvVar7 = top_blob->data;
              pAVar8 = top_blob->allocator;
              if (pAVar8 == (Allocator *)0x0) {
                if (pvVar7 != (void *)0x0) {
                  free(pvVar7);
                }
              }
              else {
                (*pAVar8->_vptr_Allocator[3])(pAVar8,pvVar7,(long)_outw % (long)iVar49 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar45 = bottom_blob->w;
          iVar49 = bottom_blob->h;
          iVar42 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar45;
          top_blob->h = iVar49;
          top_blob->d = iVar42;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
LAB_00293dcd:
        bVar53 = false;
        iVar45 = 0;
      }
      else {
        bVar53 = true;
        if (((_outw | _woffset) & 3U) == 0) {
          Mat::create(top_blob,_outw / iVar49,(local_b0 >> 2) << (uVar50 == 0) * '\x02',iVar49,
                      opt->blob_allocator);
          iVar45 = -100;
          if (top_blob->data == (void *)0x0) {
            bVar53 = false;
          }
          else {
            bVar53 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar45 = _woffset + 3;
              if (-1 < _woffset) {
                iVar45 = _woffset;
              }
              crop_pack4_sse(bottom_blob,top_blob,0,iVar45 >> 2);
              goto LAB_00293dcd;
            }
          }
        }
      }
      if (!bVar53) {
        return iVar45;
      }
    }
    if ((int)local_a8 == 2) {
      bVar53 = (_outh & 3U) == 0;
      iVar49 = (uint)bVar53 * 3 + 1;
      if (_outw == uVar1) {
        if (((_outh & 3U) != 0) || (_outh / iVar49 != uVar2)) goto LAB_00293e6e;
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pvVar7 = top_blob->data;
              pAVar8 = top_blob->allocator;
              if (pAVar8 == (Allocator *)0x0) {
                if (pvVar7 != (void *)0x0) {
                  free(pvVar7);
                }
              }
              else {
                (*pAVar8->_vptr_Allocator[3])(pAVar8,pvVar7,(long)_outh % (long)iVar49 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar45 = bottom_blob->w;
          iVar49 = bottom_blob->h;
          iVar42 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar45;
          top_blob->h = iVar49;
          top_blob->d = iVar42;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
LAB_00293f5f:
        bVar54 = false;
        iVar45 = 0;
      }
      else {
LAB_00293e6e:
        bVar54 = true;
        if (((_hoffset | _outh) & 3U) == 0) {
          Mat::create(top_blob,_outw,_outh / iVar49,(local_b0 >> 2) << bVar53 * '\x02',iVar49,
                      opt->blob_allocator);
          iVar45 = -100;
          if (top_blob->data == (void *)0x0) {
            bVar54 = false;
          }
          else {
            bVar54 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar45 = _hoffset + 3;
              if (-1 < _hoffset) {
                iVar45 = _hoffset;
              }
              crop_pack4_sse(bottom_blob,top_blob,iVar45 >> 2,_woffset);
              goto LAB_00293f5f;
            }
          }
        }
      }
      if (!bVar54) {
        return iVar45;
      }
    }
    if ((int)local_a8 == 3) {
      bVar53 = (_outc & 3U) == 0;
      iVar49 = (uint)bVar53 * 3 + 1;
      uVar51 = local_b0 >> 2;
      bVar54 = _outh != uVar2 || _outw != uVar1;
      if (bVar54) {
LAB_0029401d:
        bVar40 = true;
        if (((_coffset | _outc) & 3U) == 0) {
          m.c = _outc / iVar49;
          uVar9 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset / iVar49) * bottom_blob->cstep * uVar9 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar9;
          m.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
          uVar20 = bottom_blob->dims;
          uVar21 = bottom_blob->w;
          uVar22 = bottom_blob->h;
          uVar23 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar9 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar9;
          m.dims = uVar20;
          m.w = uVar21;
          m.h = uVar22;
          m.d = uVar23;
          if (bVar54) {
LAB_00294290:
            Mat::create(top_blob,_outw,_outh,_outc / iVar49,uVar51 << bVar53 * '\x02',iVar49,
                        opt->blob_allocator);
            iVar45 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                iVar45 = 0;
              }
              else {
                lVar52 = 0;
                do {
                  pAVar8 = m.allocator;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(m.cstep * lVar52 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize) +
                                (long)m.data);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                  pAStack_f8 = m.allocator;
                  m_2.h = top_blob->h;
                  m_2.c = top_blob->d;
                  uVar51 = top_blob->elemsize;
                  m_2.data = (void *)(top_blob->cstep * lVar52 * uVar51 + (long)top_blob->data);
                  m_2.elempack = top_blob->elempack;
                  m_2.allocator = top_blob->allocator;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = (undefined4)uVar51;
                  m_2.elemsize._4_4_ = (undefined4)(uVar51 >> 0x20);
                  m_2.d = 1;
                  sVar46 = (long)m_2.h * (long)top_blob->w;
                  m_2.w = top_blob->w;
                  m_2.dims = top_blob->dims + -1;
                  m_2.cstep = (uVar51 * sVar46 + 0xf & 0xfffffffffffffff0) / uVar51;
                  if (top_blob->dims == 4) {
                    m_2.cstep = sVar46;
                  }
                  crop_pack4_sse((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                  m_2.cstep = 0;
                  m_2.data = (void *)0x0;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = 0;
                  m_2.elemsize._4_4_ = 0;
                  m_2.elempack = 0;
                  m_2.dims = 0;
                  m_2.w = 0;
                  m_2.h = 0;
                  m_2.d = 0;
                  m_2.c = 0;
                  piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (pAVar8 == (Allocator *)0x0) {
                        if (bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*pAVar8->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_d8 = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  iStack_100 = 0;
                  uStack_f0._0_4_ = 0;
                  uStack_f0._4_4_ = 0;
                  iStack_e8 = 0;
                  iStack_e4 = 0;
                  iStack_e0 = 0;
                  lVar52 = lVar52 + 1;
                } while (lVar52 < top_blob->c);
                iVar45 = 0;
              }
            }
          }
          else {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,(int)m.elemsize,
                       m.allocator);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              piVar6 = top_blob->refcount;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              top_blob->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              top_blob->elempack = iStack_100;
              top_blob->allocator = pAStack_f8;
              top_blob->dims = (int)uStack_f0;
              top_blob->w = uStack_f0._4_4_;
              top_blob->h = iStack_e8;
              top_blob->d = iStack_e4;
              top_blob->c = iStack_e0;
              top_blob->cstep = local_d8;
            }
            piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (pAStack_f8 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*pAStack_f8->_vptr_Allocator[3])();
                }
              }
            }
            iVar45 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_00294290;
          }
          piVar6 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar40 = false;
        }
      }
      else {
        if (((_outc & 3U) != 0) || (_outc / iVar49 != local_9c)) goto LAB_0029401d;
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pvVar7 = top_blob->data;
              pAVar8 = top_blob->allocator;
              if (pAVar8 == (Allocator *)0x0) {
                if (pvVar7 != (void *)0x0) {
                  free(pvVar7);
                }
              }
              else {
                (*pAVar8->_vptr_Allocator[3])(pAVar8,pvVar7,(long)_outc % (long)iVar49 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar45 = bottom_blob->w;
          iVar49 = bottom_blob->h;
          iVar42 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar45;
          top_blob->h = iVar49;
          top_blob->d = iVar42;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        bVar40 = false;
        iVar45 = 0;
      }
      if (!bVar40) {
        return iVar45;
      }
    }
    if ((int)local_a8 == 4) {
      bVar53 = (_outc & 3U) == 0;
      iVar49 = (uint)bVar53 * 3 + 1;
      local_b0 = (local_b0 >> 2) << bVar53 * '\x02';
      bVar53 = iVar43 != _outd || (uVar2 != _outh || uVar1 != _outw);
      if (bVar53) {
LAB_002946a8:
        bVar54 = true;
        if (((_coffset | _outc) & 3U) == 0) {
          m.c = _outc / iVar49;
          uVar51 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset / iVar49) * bottom_blob->cstep * uVar51 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar51;
          m.elemsize._4_4_ = (undefined4)(uVar51 >> 0x20);
          uVar36 = bottom_blob->dims;
          uVar37 = bottom_blob->w;
          uVar38 = bottom_blob->h;
          uVar39 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar51 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar51;
          m.dims = uVar36;
          m.w = uVar37;
          m.h = uVar38;
          m.d = uVar39;
          if (bVar53) {
LAB_0029491b:
            Mat::create(top_blob,_outw,_outh,_outd,_outc / iVar49,local_b0,iVar49,
                        opt->blob_allocator);
            iVar45 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                iVar45 = 0;
              }
              else {
                lVar52 = 0;
                do {
                  if (0 < _outd) {
                    lVar48 = 0;
                    do {
                      pAVar8 = m.allocator;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           (pointer)((long)m.data +
                                    (long)(_doffset + (int)lVar48) *
                                    CONCAT44(m.elemsize._4_4_,(int)m.elemsize) *
                                    (long)m.h * (long)m.w +
                                    m.cstep * lVar52 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize));
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                      m_2.h = top_blob->h;
                      sVar46 = top_blob->elemsize;
                      m_2.elempack = top_blob->elempack;
                      m_2.allocator = top_blob->allocator;
                      m_2.cstep = (long)m_2.h * (long)top_blob->w;
                      m_2.data = (void *)((long)top_blob->data +
                                         lVar48 * sVar46 * m_2.cstep +
                                         top_blob->cstep * lVar52 * sVar46);
                      m_2.refcount._0_4_ = 0;
                      m_2.refcount._4_4_ = 0;
                      m_2.elemsize._0_4_ = (undefined4)sVar46;
                      m_2.elemsize._4_4_ = (undefined4)(sVar46 >> 0x20);
                      m_2.w = top_blob->w;
                      m_2.dims = 2;
                      m_2.d = 1;
                      m_2.c = 1;
                      crop_pack4_sse((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                      piVar6 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                      if (piVar6 != (int *)0x0) {
                        LOCK();
                        *piVar6 = *piVar6 + -1;
                        UNLOCK();
                        if (*piVar6 == 0) {
                          if (m_2.allocator == (Allocator *)0x0) {
                            if (m_2.data != (void *)0x0) {
                              free(m_2.data);
                            }
                          }
                          else {
                            (*(m_2.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_2.cstep = 0;
                      m_2.data = (void *)0x0;
                      m_2.refcount._0_4_ = 0;
                      m_2.refcount._4_4_ = 0;
                      m_2.elemsize._0_4_ = 0;
                      m_2.elemsize._4_4_ = 0;
                      m_2.elempack = 0;
                      m_2.dims = 0;
                      m_2.w = 0;
                      m_2.h = 0;
                      m_2.d = 0;
                      m_2.c = 0;
                      piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                               bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                      if (piVar6 != (int *)0x0) {
                        LOCK();
                        *piVar6 = *piVar6 + -1;
                        UNLOCK();
                        if (*piVar6 == 0) {
                          if (pAVar8 == (Allocator *)0x0) {
                            if (bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start != (pointer)0x0) {
                              free(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start);
                            }
                          }
                          else {
                            (*pAVar8->_vptr_Allocator[3])();
                          }
                        }
                      }
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      lVar48 = lVar48 + 1;
                    } while (lVar48 < _outd);
                  }
                  lVar52 = lVar52 + 1;
                } while (lVar52 < top_blob->c);
                iVar45 = 0;
              }
            }
          }
          else {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,(int)m.elemsize,
                       m.allocator);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              piVar6 = top_blob->refcount;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              top_blob->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              top_blob->elempack = iStack_100;
              top_blob->allocator = pAStack_f8;
              top_blob->dims = (int)uStack_f0;
              top_blob->w = uStack_f0._4_4_;
              top_blob->h = iStack_e8;
              top_blob->d = iStack_e4;
              top_blob->c = iStack_e0;
              top_blob->cstep = local_d8;
            }
            piVar6 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (pAStack_f8 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*pAStack_f8->_vptr_Allocator[3])();
                }
              }
            }
            iVar45 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_0029491b;
          }
          piVar6 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          bVar54 = false;
        }
      }
      else {
        if (((_outc & 3U) != 0) || (_outc / iVar49 != local_9c)) goto LAB_002946a8;
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pvVar7 = top_blob->data;
              pAVar8 = top_blob->allocator;
              if (pAVar8 == (Allocator *)0x0) {
                if (pvVar7 != (void *)0x0) {
                  free(pvVar7);
                }
              }
              else {
                (*pAVar8->_vptr_Allocator[3])(pAVar8,pvVar7,(long)_outc % (long)iVar49 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar43 = bottom_blob->w;
          iVar45 = bottom_blob->h;
          iVar49 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar43;
          top_blob->h = iVar45;
          top_blob->d = iVar49;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        bVar54 = false;
        iVar45 = 0;
      }
      if (!bVar54) {
        return iVar45;
      }
    }
  }
  m.data = bottom_blob->data;
  piVar6 = bottom_blob->refcount;
  m.refcount._0_4_ = SUB84(piVar6,0);
  m.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
  m.elemsize._0_4_ = (int)bottom_blob->elemsize;
  m.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  m.elempack = bottom_blob->elempack;
  m.allocator = bottom_blob->allocator;
  uVar24 = bottom_blob->dims;
  uVar25 = bottom_blob->w;
  uVar26 = bottom_blob->h;
  uVar27 = bottom_blob->d;
  m.c = bottom_blob->c;
  m.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  m.dims = uVar24;
  m.w = uVar25;
  m.h = uVar26;
  m.d = uVar27;
  if (iVar3 != 1) {
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)opt;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = (int)opt->workspace_allocator;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = SUB84(opt->workspace_allocator,0);
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    convert_packing(bottom_blob,&m,1,(Option *)&bottom_blob_shapes);
    if (m.data == (void *)0x0 || (long)m.c * m.cstep == 0) {
      iVar43 = -100;
      goto LAB_00294d3f;
    }
  }
  iVar43 = Crop::forward(&this->super_Crop,&m,top_blob,opt);
LAB_00294d3f:
  piVar6 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar43;
}

Assistant:

int Crop_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    int _woffset, _hoffset, _doffset, _coffset;
    int _outw, _outh, _outd, _outc;
    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blob_shapes(1);
        bottom_blob_shapes[0] = bottom_blob.shape();
        eval_crop_expr(bottom_blob_shapes, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}